

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O0

int ImGuizmo::GetMoveType(vec_t *gizmoHitProportion)

{
  float *dirPlaneX_00;
  ImGuiIO *pIVar1;
  float f;
  vec_t vVar2;
  undefined8 local_110;
  undefined8 local_108;
  vec_t local_100;
  vec_t local_f0;
  float local_e0;
  float dy;
  vec_t vStack_dc;
  vec_t local_cc;
  float local_bc;
  float dx;
  vec_t vStack_b8;
  undefined1 local_a8 [8];
  vec_t posOnPlan;
  float len;
  int planNormal;
  bool belowPlaneLimit;
  bool belowAxisLimit;
  vec_t dirPlaneY;
  vec_t dirPlaneX;
  uint i;
  vec_t direction [3];
  int local_1c;
  int type;
  ImGuiIO *io;
  vec_t *gizmoHitProportion_local;
  
  pIVar1 = ImGui::GetIO();
  local_1c = 0;
  if ((((_DAT_00297064 <= (pIVar1->MousePos).x) && ((pIVar1->MousePos).x <= DAT_0029706c)) &&
      (_DAT_00297068 <= (pIVar1->MousePos).y)) && ((pIVar1->MousePos).y <= DAT_00297070)) {
    local_1c = 7;
  }
  stack0xffffffffffffffa8 = DAT_00296e6c;
  for (dirPlaneX.z = 0.0; (uint)dirPlaneX.z < 3 && local_1c == 0;
      dirPlaneX.z = (float)((int)dirPlaneX.z + 1)) {
    dirPlaneX_00 = &dirPlaneY.z;
    ComputeTripodAxisAndVisibility
              ((int)dirPlaneX.z,(vec_t *)dirPlaneX_00,(vec_t *)&planNormal,(bool *)((long)&len + 3),
               (bool *)((long)&len + 2));
    vec_t::TransformVector((vec_t *)dirPlaneX_00,(matrix_t *)&DAT_00296e6c);
    vec_t::TransformVector((vec_t *)&planNormal,(matrix_t *)&DAT_00296e6c);
    join_0x00001240_0x00001200_ =
         BuildPlan((vec_t *)&DAT_00296e9c,
                   (vec_t *)&(&dirPlaneX)
                             [(int)((int)dirPlaneX.z + 2 + (((int)dirPlaneX.z + 2U) / 3) * -3)].w);
    f = IntersectRayPlane((vec_t *)&DAT_0029703c,(vec_t *)&DAT_0029704c,(vec_t *)&posOnPlan.z);
    vStack_b8 = vec_t::operator*((vec_t *)&DAT_0029704c,f);
    _local_a8 = vec_t::operator+((vec_t *)&DAT_0029703c,&stack0xffffffffffffff48);
    vStack_dc = vec_t::operator-((vec_t *)local_a8,(vec_t *)&DAT_00296e9c);
    local_cc = vec_t::operator*(&stack0xffffffffffffff24,1.0 / DAT_00297074);
    local_bc = vec_t::Dot3((vec_t *)dirPlaneX_00,&local_cc);
    vVar2 = vec_t::operator-((vec_t *)local_a8,(vec_t *)&DAT_00296e9c);
    local_100._8_8_ = vVar2._8_8_;
    local_100._0_8_ = vVar2._0_8_;
    local_f0 = vec_t::operator*(&local_100,1.0 / DAT_00297074);
    local_e0 = vec_t::Dot3((vec_t *)&planNormal,&local_f0);
    if ((((len._3_1_ & 1) != 0) && (-0.1 < local_e0)) &&
       ((local_e0 < 0.1 && ((0.1 < local_bc && (local_bc < 1.0)))))) {
      local_1c = (int)dirPlaneX.z + 1;
    }
    if (((((len._2_1_ & 1) != 0) && ((float)0x3f000000 <= local_bc)) && (local_bc <= 0.8)) &&
       (((float)0x3f000000 <= local_e0 && (local_e0 <= 0.8)))) {
      local_1c = (int)dirPlaneX.z + 4;
    }
    if (gizmoHitProportion != (vec_t *)0x0) {
      vVar2 = makeVect(local_bc,local_e0,0.0,0.0);
      local_110 = vVar2._0_8_;
      gizmoHitProportion->x = (float)(undefined4)local_110;
      gizmoHitProportion->y = (float)local_110._4_4_;
      local_108 = vVar2._8_8_;
      gizmoHitProportion->z = (float)(undefined4)local_108;
      gizmoHitProportion->w = (float)local_108._4_4_;
    }
  }
  return local_1c;
}

Assistant:

static int GetMoveType(vec_t *gizmoHitProportion)
   {
      ImGuiIO& io = ImGui::GetIO();
      int type = NONE;

      // screen
      if (io.MousePos.x >= gContext.mScreenSquareMin.x && io.MousePos.x <= gContext.mScreenSquareMax.x &&
         io.MousePos.y >= gContext.mScreenSquareMin.y && io.MousePos.y <= gContext.mScreenSquareMax.y)
         type = MOVE_SCREEN;

      const vec_t direction[3] = { gContext.mModel.v.right, gContext.mModel.v.up, gContext.mModel.v.dir };

      // compute
      for (unsigned int i = 0; i < 3 && type == NONE; i++)
      {
         vec_t dirPlaneX, dirPlaneY;
         bool belowAxisLimit, belowPlaneLimit;
         ComputeTripodAxisAndVisibility(i, dirPlaneX, dirPlaneY, belowAxisLimit, belowPlaneLimit);
         dirPlaneX.TransformVector(gContext.mModel);
         dirPlaneY.TransformVector(gContext.mModel);

         const int planNormal = (i + 2) % 3;

         const float len = IntersectRayPlane(gContext.mRayOrigin, gContext.mRayVector, BuildPlan(gContext.mModel.v.position, direction[planNormal]));
         vec_t posOnPlan = gContext.mRayOrigin + gContext.mRayVector * len;

         const float dx = dirPlaneX.Dot3((posOnPlan - gContext.mModel.v.position) * (1.f / gContext.mScreenFactor));
         const float dy = dirPlaneY.Dot3((posOnPlan - gContext.mModel.v.position) * (1.f / gContext.mScreenFactor));
         if (belowAxisLimit && dy > -0.1f && dy < 0.1f && dx > 0.1f  && dx < 1.f)
            type = MOVE_X + i;

         if (belowPlaneLimit && dx >= quadUV[0] && dx <= quadUV[4] && dy >= quadUV[1] && dy <= quadUV[3])
            type = MOVE_XY + i;

         if (gizmoHitProportion)
            *gizmoHitProportion = makeVect(dx, dy, 0.f);
      }
      return type;
   }